

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O3

vector<bool,_std::allocator<bool>_> *
FromBytes(vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,
         span<const_std::byte,_18446744073709551615UL> source)

{
  _Bit_type *p_Var1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  _Bit_type _Var5;
  int bit_i;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long in_FS_OFFSET;
  allocator_type local_22;
  bool local_21;
  vector<bool,_std::allocator<bool>_> *local_20;
  
  local_20 = *(vector<bool,_std::allocator<bool>_> **)(in_FS_OFFSET + 0x28);
  iVar2 = (int)source._M_extent._M_extent_value << 3;
  local_21 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,(long)iVar2,&local_21,&local_22);
  uVar9 = iVar2 >> 3;
  if (0 < (int)uVar9) {
    p_Var1 = (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar3 = 0;
    do {
      uVar4 = (uint)(uVar3 >> 3) & 0x3ffffff;
      _Var5 = p_Var1[uVar4];
      lVar6 = 0;
      do {
        uVar7 = (ulong)(((uint)uVar3 & 7) * 8 + (uint)lVar6);
        uVar8 = _Var5 & ~(1L << (uVar7 & 0x3f));
        _Var5 = _Var5 | 1L << (uVar7 & 0x3f);
        if ((source._M_ptr[uVar3] >> ((uint)lVar6 & 0x1f) & 1) == 0) {
          _Var5 = uVar8;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      p_Var1[uVar4] = _Var5;
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar9);
  }
  if (*(vector<bool,_std::allocator<bool>_> **)(in_FS_OFFSET + 0x28) == local_20) {
    return *(vector<bool,_std::allocator<bool>_> **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<bool> FromBytes(std::span<const std::byte> source)
{
    int vector_size(source.size() * 8);
    std::vector<bool> result(vector_size);
    for (int byte_i = 0; byte_i < vector_size / 8; ++byte_i) {
        uint8_t cur_byte{std::to_integer<uint8_t>(source[byte_i])};
        for (int bit_i = 0; bit_i < 8; ++bit_i) {
            result[byte_i * 8 + bit_i] = (cur_byte >> bit_i) & 1;
        }
    }
    return result;
}